

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

AppleSDK __thiscall cmMakefile::GetAppleSDKType(cmMakefile *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  AppleSDK AVar4;
  string sdkRoot;
  anon_struct_40_2_65dcf250 sdkDatabase [6];
  allocator<char> local_18c;
  allocator<char> local_18b;
  allocator<char> local_18a;
  allocator<char> local_189;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  AppleSDK local_108 [2];
  string local_100 [32];
  undefined4 local_e0;
  string local_d8 [32];
  undefined4 local_b8;
  string local_b0 [32];
  undefined4 local_90;
  string local_88 [32];
  undefined4 local_68;
  string local_60 [32];
  undefined4 local_40;
  
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  local_188._M_string_length = 0;
  local_188.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"CMAKE_OSX_SYSROOT",(allocator<char> *)&local_148);
  GetSafeDefinition(this,&local_128);
  std::__cxx11::string::_M_assign((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_128);
  cmsys::SystemTools::LowerCase(&local_128,&local_188);
  std::__cxx11::string::operator=((string *)&local_188,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"appletvos",(allocator<char> *)&local_148);
  local_108[0] = AppleTVOS;
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"appletvsimulator",(allocator<char> *)&local_168);
  local_e0 = 4;
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"iphoneos",&local_18c);
  local_b8 = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"iphonesimulator",&local_189);
  local_90 = 2;
  std::__cxx11::string::string<std::allocator<char>>(local_88,"watchos",&local_18a);
  local_68 = 5;
  std::__cxx11::string::string<std::allocator<char>>(local_60,"watchsimulator",&local_18b);
  local_40 = 6;
  lVar2 = 0;
  do {
    lVar1 = lVar2;
    if (lVar1 == 0xf0) {
      AVar4 = MacOS;
      goto LAB_0016e5d8;
    }
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&local_128._M_dataplus._M_p + lVar1);
    lVar2 = std::__cxx11::string::find((string *)&local_188,(ulong)__rhs);
    if (lVar2 == 0) break;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"/",&local_18c);
    std::operator+(&local_148,&local_168,__rhs);
    lVar3 = std::__cxx11::string::find((string *)&local_188,(ulong)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    lVar2 = lVar1 + 0x28;
  } while (lVar3 == -1);
  AVar4 = *(AppleSDK *)((long)local_108 + lVar1);
LAB_0016e5d8:
  lVar2 = 200;
  do {
    std::__cxx11::string::~string((string *)((long)&local_128._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  std::__cxx11::string::~string((string *)&local_188);
  return AVar4;
}

Assistant:

cmMakefile::AppleSDK cmMakefile::GetAppleSDKType() const
{
  std::string sdkRoot;
  sdkRoot = this->GetSafeDefinition("CMAKE_OSX_SYSROOT");
  sdkRoot = cmSystemTools::LowerCase(sdkRoot);

  struct
  {
    std::string name;
    AppleSDK sdk;
  } const sdkDatabase[]{
    { "appletvos", AppleSDK::AppleTVOS },
    { "appletvsimulator", AppleSDK::AppleTVSimulator },
    { "iphoneos", AppleSDK::IPhoneOS },
    { "iphonesimulator", AppleSDK::IPhoneSimulator },
    { "watchos", AppleSDK::WatchOS },
    { "watchsimulator", AppleSDK::WatchSimulator },
  };

  for (auto const& entry : sdkDatabase) {
    if (sdkRoot.find(entry.name) == 0 ||
        sdkRoot.find(std::string("/") + entry.name) != std::string::npos) {
      return entry.sdk;
    }
  }

  return AppleSDK::MacOS;
}